

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O3

double __thiscall CEPlanet::EarthDist_AU(CEPlanet *this,CEDate *date)

{
  double dVar1;
  double dVar2;
  double dVar3;
  CEPlanetAlgo CVar4;
  reference pvVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  vector<double,_std::allocator<double>_> pos;
  CEPlanet earth;
  vector<double,_std::allocator<double>_> local_170;
  CEPlanet local_158;
  
  Earth();
  CVar4 = Algorithm(this);
  local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start._4_4_,CVar4);
  SetAlgorithm(&local_158,(CEPlanetAlgo *)&local_170);
  (*date->_vptr_CEDate[4])(date);
  UpdatePosition(&local_158,(double *)&local_170);
  std::vector<double,_std::allocator<double>_>::vector(&local_170,&this->pos_icrs_);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_170,0);
  dVar1 = *pvVar5;
  dVar6 = GetXICRS(&local_158);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_170,1);
  dVar2 = *pvVar5;
  dVar7 = GetYICRS(&local_158);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_170,2);
  dVar3 = *pvVar5;
  dVar8 = GetZICRS(&local_158);
  std::vector<double,_std::allocator<double>_>::~vector(&local_170);
  ~CEPlanet(&local_158);
  return SQRT((dVar3 - dVar8) * (dVar3 - dVar8) +
              (dVar1 - dVar6) * (dVar1 - dVar6) + (dVar2 - dVar7) * (dVar2 - dVar7));
}

Assistant:

double CEPlanet::EarthDist_AU(const CEDate& date)
{
    // Compute the position of the earth relative to the planet to account
    // for the time delay of the planet
    CEPlanet earth = CEPlanet::Earth();
    earth.SetAlgorithm(Algorithm());
    earth.UpdatePosition(date.JD());

    std::vector<double> pos = pos_icrs_;
    double x = pos[0] - earth.GetXICRS();
    double y = pos[1] - earth.GetYICRS();
    double z = pos[2] - earth.GetZICRS();

    // Compute the light travel time from the planet to Earth in days
    return std::sqrt(x*x + y*y + z*z);
}